

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::TestCaseFilters::shouldInclude(TestCaseFilters *this,TestCase *testCase)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  pointer this_00;
  pointer pTVar4;
  const_iterator it;
  pointer pTVar5;
  pointer pTVar6;
  
  pTVar5 = (this->m_tagExpressions).
           super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->m_tagExpressions).
           super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar5 == pTVar1) {
LAB_00136402:
    pTVar6 = (this->m_inclusionFilters).
             super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = (this->m_inclusionFilters).
             super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar6 == pTVar4) {
      pTVar6 = (this->m_exclusionFilters).
               super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (this->m_exclusionFilters).
               super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar6 == pTVar4) {
        if ((this->m_tagExpressions).
            super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->m_tagExpressions).
            super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          return (bool)((testCase->super_TestCaseInfo).isHidden ^ 1);
        }
        return true;
      }
LAB_00136460:
      if (pTVar6 == pTVar4) {
        return true;
      }
      do {
        bVar3 = TestCaseFilter::isMatch(pTVar6,testCase);
        bVar3 = (pTVar6->m_filterType != IncludeTests) != bVar3;
        if (!bVar3) {
          return bVar3;
        }
        pTVar6 = pTVar6 + 1;
      } while (pTVar6 != pTVar4);
      return bVar3;
    }
    do {
      bVar3 = TestCaseFilter::isMatch(pTVar6,testCase);
      if ((pTVar6->m_filterType != IncludeTests) != bVar3) {
        if (pTVar6 == pTVar4) {
          return false;
        }
        pTVar6 = (this->m_exclusionFilters).
                 super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar4 = (this->m_exclusionFilters).
                 super__Vector_base<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        goto LAB_00136460;
      }
      pTVar6 = pTVar6 + 1;
    } while (pTVar6 != pTVar4);
  }
  else {
    do {
      pTVar2 = (pTVar5->m_tagSets).super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (pTVar5->m_tagSets).
                     super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
                     super__Vector_impl_data._M_start; this_00 != pTVar2; this_00 = this_00 + 1) {
        bVar3 = TagSet::matches(this_00,&(testCase->super_TestCaseInfo).tags);
        if (bVar3) {
          if (pTVar5 == pTVar1) {
            return false;
          }
          goto LAB_00136402;
        }
      }
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != pTVar1);
  }
  return false;
}

Assistant:

bool shouldInclude( TestCase const& testCase ) const {
            if( !m_tagExpressions.empty() ) {
                std::vector<TagExpression>::const_iterator it = m_tagExpressions.begin();
                std::vector<TagExpression>::const_iterator itEnd = m_tagExpressions.end();
                for(; it != itEnd; ++it )
                    if( it->matches( testCase.getTags() ) )
                        break;
                if( it == itEnd )
                    return false;
            }

            if( !m_inclusionFilters.empty() ) {
                std::vector<TestCaseFilter>::const_iterator it = m_inclusionFilters.begin();
                std::vector<TestCaseFilter>::const_iterator itEnd = m_inclusionFilters.end();
                for(; it != itEnd; ++it )
                    if( it->shouldInclude( testCase ) )
                        break;
                if( it == itEnd )
                    return false;
            }
            else if( m_exclusionFilters.empty() && m_tagExpressions.empty() ) {
                return !testCase.isHidden();
            }

            std::vector<TestCaseFilter>::const_iterator it = m_exclusionFilters.begin();
            std::vector<TestCaseFilter>::const_iterator itEnd = m_exclusionFilters.end();
            for(; it != itEnd; ++it )
                if( !it->shouldInclude( testCase ) )
                    return false;
            return true;
        }